

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O3

int testSystemTools(int param_1,char **param_2)

{
  undefined8 uVar1;
  char cVar2;
  undefined1 auVar3 [16];
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  long *plVar10;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string *psVar12;
  long *plVar13;
  _Alloc_hider _Var14;
  undefined4 uVar15;
  char *pcVar16;
  undefined8 in_R8;
  size_t size;
  pointer pbVar17;
  byte bVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_type __dnew;
  size_type __dnew_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string output;
  size_type __dnew_2;
  string test;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathes;
  string local_310;
  byte local_2e9;
  string local_2e8;
  byte local_2c7;
  byte local_2c6;
  byte local_2c5;
  byte local_2c4;
  byte local_2c3;
  byte local_2c2;
  byte local_2c1;
  byte local_2c0;
  byte local_2bf;
  byte local_2be;
  byte local_2bd;
  byte local_2bc;
  byte local_2bb;
  byte local_2ba;
  byte local_2b9;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  undefined4 local_29c;
  string local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  undefined4 local_258;
  undefined4 local_254;
  string local_250;
  byte abStack_230 [488];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_2e9 = 1;
  pcVar16 = "/usr/local/bin/passwd";
  lVar19 = 0x10;
  do {
    std::__cxx11::string::string((string *)&local_250,pcVar16,(allocator *)&local_2e8);
    std::__cxx11::string::string
              ((string *)&local_310,
               *(char **)((long)&cmakeGeneratedFunctionMapEntries[10].func + lVar19),
               (allocator *)&local_298);
    bVar5 = CheckConvertToUnixSlashes(&local_250,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT17(local_310.field_2._M_local_buf[7],
                               local_310.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_2e9 = local_2e9 & bVar5;
    pcVar16 = *(char **)((long)toUnixPaths[0] + lVar19);
    lVar19 = lVar19 + 0x10;
  } while (lVar19 != 0x100);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  bVar5 = cmsys::SystemTools::GetEnv("HOME",&local_298);
  if (bVar5) {
    std::__cxx11::string::append((char *)&local_298);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"~/foo bar/lala","");
    bVar5 = CheckConvertToUnixSlashes(&local_250,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_2e9 = local_2e9 & bVar5;
  }
  pcVar16 = "1 foo 2 bar 2";
  lVar19 = 0;
  do {
    std::__cxx11::string::string((string *)&local_310,pcVar16,(allocator *)local_2b8);
    pcVar16 = *(char **)((long)checkEscapeChars[0] + lVar19 + 8);
    cVar2 = **(char **)((long)checkEscapeChars[0] + lVar19 + 0x10);
    std::__cxx11::string::string
              ((string *)&local_2e8,*(char **)((long)checkEscapeChars[0] + lVar19 + 0x18),
               (allocator *)&local_278);
    cmsys::SystemTools::EscapeChars_abi_cxx11_
              (&local_250,(SystemTools *)local_310._M_dataplus._M_p,pcVar16,
               (char *)(ulong)(uint)(int)cVar2,(char)in_R8);
    _Var14._M_p = local_250._M_dataplus._M_p;
    if ((local_250._M_string_length != local_2e8._M_string_length) ||
       ((bVar18 = 1, local_250._M_string_length != 0 &&
        (iVar7 = bcmp(local_250._M_dataplus._M_p,local_2e8._M_dataplus._M_p,
                      local_250._M_string_length), iVar7 != 0)))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with CheckEscapeChars - input: ",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_310._M_dataplus._M_p,
                          local_310._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," output: ",9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," expected: ",0xb);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      bVar18 = 0;
      _Var14._M_p = local_250._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var14._M_p != &local_250.field_2) {
      operator_delete(_Var14._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                        CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                          local_2e8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT17(local_310.field_2._M_local_buf[7],
                               local_310.field_2._M_allocated_capacity._0_7_) + 1);
    }
    local_2e9 = local_2e9 & bVar18;
    pcVar16 = *(char **)((long)checkEscapeChars[1] + lVar19);
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x40);
  local_2b9 = CheckFileOperations();
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x17;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"mary had a little lamb.",0x17);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  cmsys::SystemTools::CapitalizedWords(&local_310,&local_250);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  uVar15 = (undefined4)CONCAT71(0x14d7,iVar7 == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CapitalizedWords ",0x1e);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_310,1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_310,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)local_250._M_string_length,0x13d0fe);
  cmsys::SystemTools::UnCapitalizedWords(&local_310,&local_250);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with UnCapitalizedWords ",0x20);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_310,1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_310,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    uVar15 = 0;
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)local_250._M_string_length,0x13d156);
  cmsys::SystemTools::AddSpaceBetweenCapitalizedWords(&local_310,&local_250);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AddSpaceBetweenCapitalizedWords ",0x2d);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_310,1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_250._M_dataplus._M_p,local_250._M_string_length);
    local_310._M_dataplus._M_p._0_1_ = 0x22;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_310,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    uVar15 = 0;
  }
  pcVar16 = cmsys::SystemTools::AppendStrings("Mary Had A"," Little Lamb.");
  iVar7 = strcmp(pcVar16,"Mary Had A Little Lamb.");
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AppendStrings ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A\" \" Little Lamb.\"",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  if (pcVar16 != (char *)0x0) {
    operator_delete__(pcVar16);
  }
  pcVar16 = cmsys::SystemTools::AppendStrings("Mary Had"," A ","Little Lamb.");
  iVar7 = strcmp(pcVar16,"Mary Had A Little Lamb.");
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with AppendStrings ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had\" \" A \" \"Little Lamb.\"",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  if (pcVar16 != (char *)0x0) {
    operator_delete__(pcVar16);
  }
  sVar9 = cmsys::SystemTools::CountChar("Mary Had A Little Lamb.",'a');
  if (sVar9 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CountChar ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  pcVar16 = cmsys::SystemTools::RemoveChars("Mary Had A Little Lamb.","aeiou");
  iVar7 = strcmp(pcVar16,"Mry Hd A Lttl Lmb.");
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with RemoveChars ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  if (pcVar16 != (char *)0x0) {
    operator_delete__(pcVar16);
  }
  pcVar16 = cmsys::SystemTools::RemoveCharsButUpperHex("Mary Had A Little Lamb.");
  if ((*pcVar16 != 'A') || (pcVar16[1] != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with RemoveCharsButUpperHex ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  operator_delete__(pcVar16);
  pcVar16 = (char *)operator_new__(0x18);
  builtin_strncpy(pcVar16,"Mary Had A Little Lamb.",0x18);
  cmsys::SystemTools::ReplaceChars(pcVar16,"aeiou",'X');
  uVar1 = *(undefined8 *)(pcVar16 + 0x10);
  auVar21[0] = -((char)uVar1 == 'X');
  auVar21[1] = -((char)((ulong)uVar1 >> 8) == ' ');
  auVar21[2] = -((char)((ulong)uVar1 >> 0x10) == 'L');
  auVar21[3] = -((char)((ulong)uVar1 >> 0x18) == 'X');
  auVar21[4] = -((char)((ulong)uVar1 >> 0x20) == 'm');
  auVar21[5] = -((char)((ulong)uVar1 >> 0x28) == 'b');
  auVar21[6] = -((char)((ulong)uVar1 >> 0x30) == '.');
  auVar21[7] = -((char)((ulong)uVar1 >> 0x38) == '\0');
  auVar21[8] = 0xff;
  auVar21[9] = 0xff;
  auVar21[10] = 0xff;
  auVar21[0xb] = 0xff;
  auVar21[0xc] = 0xff;
  auVar21[0xd] = 0xff;
  auVar21[0xe] = 0xff;
  auVar21[0xf] = 0xff;
  auVar20[0] = -(*pcVar16 == 'M');
  auVar20[1] = -(pcVar16[1] == 'X');
  auVar20[2] = -(pcVar16[2] == 'r');
  auVar20[3] = -(pcVar16[3] == 'y');
  auVar20[4] = -(pcVar16[4] == ' ');
  auVar20[5] = -(pcVar16[5] == 'H');
  auVar20[6] = -(pcVar16[6] == 'X');
  auVar20[7] = -(pcVar16[7] == 'd');
  auVar20[8] = -(pcVar16[8] == ' ');
  auVar20[9] = -(pcVar16[9] == 'A');
  auVar20[10] = -(pcVar16[10] == ' ');
  auVar20[0xb] = -(pcVar16[0xb] == 'L');
  auVar20[0xc] = -(pcVar16[0xc] == 'X');
  auVar20[0xd] = -(pcVar16[0xd] == 't');
  auVar20[0xe] = -(pcVar16[0xe] == 't');
  auVar20[0xf] = -(pcVar16[0xf] == 'l');
  auVar20 = auVar20 & auVar21;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ReplaceChars ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  operator_delete__(pcVar16);
  bVar5 = cmsys::SystemTools::StringStartsWith("Mary Had A Little Lamb.","Mary ");
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with StringStartsWith ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  bVar5 = cmsys::SystemTools::StringEndsWith("Mary Had A Little Lamb."," Lamb.");
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with StringEndsWith ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  pcVar16 = cmsys::SystemTools::DuplicateString("Mary Had A Little Lamb.");
  iVar7 = strcmp(pcVar16,"Mary Had A Little Lamb.");
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with DuplicateString ",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  if (pcVar16 != (char *)0x0) {
    operator_delete__(pcVar16);
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)local_250._M_string_length,0x13d0fe);
  cmsys::SystemTools::CropString(&local_310,&local_250,0xd);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with CropString ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (pointer)0x0;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2e8._M_dataplus._M_p = (pointer)0x17;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2e8);
  local_310.field_2._M_allocated_capacity._0_7_ = SUB87(local_2e8._M_dataplus._M_p,0);
  local_310.field_2._M_local_buf[7] = (char)((ulong)local_2e8._M_dataplus._M_p >> 0x38);
  *(undefined8 *)local_310._M_dataplus._M_p = 0x646148207972614d;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 8) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 9) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 10) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xb) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xc) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xd) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xe) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xf) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0xf) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x10) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x11) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x12) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x13) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x14) = 'm';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x15) = 'b';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p + 0x16) = '.';
  local_310._M_string_length = (size_type)local_2e8._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_2e8._M_dataplus._M_p] = '\0';
  cmsys::SystemTools::Split
            (&local_310,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  iVar7 = std::__cxx11::string::compare((char *)local_2b8._0_8_);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)(local_2b8._0_8_ + 0x20));
    if (iVar7 != 0) goto LAB_0011b060;
    iVar7 = std::__cxx11::string::compare((char *)(local_2b8._0_8_ + 0x40));
    if (iVar7 != 0) goto LAB_0011b060;
    iVar7 = std::__cxx11::string::compare((char *)(local_2b8._0_8_ + 0x60));
    if (iVar7 != 0) goto LAB_0011b060;
    iVar7 = std::__cxx11::string::compare((char *)(local_2b8._0_8_ + 0x80));
    if (iVar7 != 0) goto LAB_0011b060;
  }
  else {
LAB_0011b060:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with Split ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"Mary Had A Little Lamb.\"",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x29;
  local_2e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_278);
  local_2e8.field_2._M_local_buf[0] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_1_;
  local_2e8.field_2._M_local_buf[1] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_;
  local_2e8.field_2._M_allocated_capacity._2_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._2_2_;
  local_2e8.field_2._M_allocated_capacity._4_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_2_;
  local_2e8.field_2._M_allocated_capacity._6_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._6_2_;
  builtin_strncpy(local_2e8._M_dataplus._M_p,"L://Local Mojo/Hex Power Pack/Iffy Voodoo",0x29);
  local_2e8._M_string_length =
       (size_type)
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2e8._M_dataplus._M_p
  [(long)local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  cmsys::SystemTools::ConvertToWindowsOutputPath(&local_310,&local_2e8);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"L://Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2f;
  local_2e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_278);
  local_2e8.field_2._M_local_buf[0] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_1_;
  local_2e8.field_2._M_local_buf[1] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_;
  local_2e8.field_2._M_allocated_capacity._2_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._2_2_;
  local_2e8.field_2._M_allocated_capacity._4_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_2_;
  local_2e8.field_2._M_allocated_capacity._6_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._6_2_;
  builtin_strncpy(local_2e8._M_dataplus._M_p,"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo",0x2f)
  ;
  local_2e8._M_string_length =
       (size_type)
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2e8._M_dataplus._M_p
  [(long)local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  cmsys::SystemTools::ConvertToWindowsOutputPath(&local_310,&local_2e8);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x27;
  local_2e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_278);
  local_2e8.field_2._M_local_buf[0] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_1_;
  local_2e8.field_2._M_local_buf[1] =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_1_;
  local_2e8.field_2._M_allocated_capacity._2_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._2_2_;
  local_2e8.field_2._M_allocated_capacity._4_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_2_;
  local_2e8.field_2._M_allocated_capacity._6_2_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._6_2_;
  builtin_strncpy(local_2e8._M_dataplus._M_p,"//Local Mojo/Hex Power Pack/Iffy Voodoo",0x27);
  local_2e8._M_string_length =
       (size_type)
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2e8._M_dataplus._M_p
  [(long)local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start] = '\0';
  cmsys::SystemTools::ConvertToUnixOutputPath(&local_310,&local_2e8);
  iVar7 = std::__cxx11::string::compare((char *)&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with ConvertToUnixOutputPath ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\"//Local Mojo/Hex Power Pack/Iffy Voodoo\"",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    uVar15 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250.field_2._M_allocated_capacity._0_4_ = 0x423d41;
  local_250._M_string_length = 3;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_2ba = CheckPutEnv(&local_250,"A","B");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250.field_2._M_allocated_capacity._0_4_ = 0x433d42;
  local_250._M_string_length = 3;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_2bb = CheckPutEnv(&local_250,"B","C");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250.field_2._M_allocated_capacity._0_4_ = 0x443d43;
  local_250._M_string_length = 3;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_2bc = CheckPutEnv(&local_250,"C","D");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250.field_2._M_allocated_capacity._0_4_ = 0x453d44;
  local_250._M_string_length = 3;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_2bd = CheckPutEnv(&local_250,"D","E");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_2be = CheckUnPutEnv("A","A");
  local_2bf = CheckUnPutEnv("B=","B");
  local_2c0 = CheckUnPutEnv("C=D","C");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x6168732f;
  local_250.field_2._8_2_ = 0x6572;
  local_250._M_string_length = 10;
  local_250.field_2._M_local_buf[10] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310.field_2._M_allocated_capacity._0_7_ = 0x61622f6e69622f;
  local_310.field_2._M_local_buf[7] = 's';
  local_310.field_2._8_2_ = 0x68;
  local_310._M_string_length = 9;
  local_2e8.field_2._M_local_buf[0] = '.';
  local_2e8.field_2._M_local_buf[1] = '.';
  local_2e8.field_2._M_allocated_capacity._2_2_ = 0x2e2f;
  local_2e8.field_2._M_allocated_capacity._4_2_ = 0x2f2e;
  local_2e8.field_2._M_allocated_capacity._6_2_ = 0x6962;
  local_2e8.field_2._8_6_ = 0x687361622f6e;
  local_2e8._M_string_length = 0xe;
  local_2e8.field_2._M_local_buf[0xe] = '\0';
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_254 = uVar15;
  local_2c1 = CheckRelativePath(&local_250,&local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x732f2e2f;
  local_250.field_2._8_2_ = 0x6168;
  local_250.field_2._M_local_buf[10] = 'r';
  local_250.field_2._M_local_buf[0xb] = 'e';
  local_250.field_2._M_local_buf[0xc] = '/';
  local_250._M_string_length = 0xd;
  local_250.field_2._M_local_buf[0xd] = '\0';
  local_310.field_2._M_allocated_capacity._0_7_ = 0x61622f6e69622f;
  local_310.field_2._M_local_buf[7] = 's';
  local_310.field_2._8_2_ = 0x68;
  local_310._M_string_length = 9;
  local_2e8.field_2._M_local_buf[0] = '.';
  local_2e8.field_2._M_local_buf[1] = '.';
  local_2e8.field_2._M_allocated_capacity._2_2_ = 0x2e2f;
  local_2e8.field_2._M_allocated_capacity._4_2_ = 0x2f2e;
  local_2e8.field_2._M_allocated_capacity._6_2_ = 0x6962;
  local_2e8.field_2._8_6_ = 0x687361622f6e;
  local_2e8._M_string_length = 0xe;
  local_2e8.field_2._M_local_buf[0xe] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2c2 = CheckRelativePath(&local_250,&local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x68732f2f;
  local_250.field_2._8_2_ = 0x7261;
  local_250.field_2._M_local_buf[10] = 'e';
  local_250.field_2._M_local_buf[0xb] = '/';
  local_250._M_string_length = 0xc;
  local_250.field_2._M_local_buf[0xc] = '\0';
  local_310.field_2._M_allocated_capacity._0_7_ = 0x61622f6e69622f;
  local_310.field_2._M_local_buf[7] = 's';
  local_310.field_2._8_2_ = 0x68;
  local_310._M_string_length = 9;
  local_2e8.field_2._M_local_buf[0] = '.';
  local_2e8.field_2._M_local_buf[1] = '.';
  local_2e8.field_2._M_allocated_capacity._2_2_ = 0x2e2f;
  local_2e8.field_2._M_allocated_capacity._4_2_ = 0x2f2e;
  local_2e8.field_2._M_allocated_capacity._6_2_ = 0x6962;
  local_2e8.field_2._8_6_ = 0x687361622f6e;
  local_2e8._M_string_length = 0xe;
  local_2e8.field_2._M_local_buf[0xe] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2c3 = CheckRelativePath(&local_250,&local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x12;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"/usr/share/../bin/",0x12);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  local_310.field_2._M_allocated_capacity._0_7_ = 0x61622f6e69622f;
  local_310.field_2._M_local_buf[7] = 's';
  local_310.field_2._8_2_ = 0x68;
  local_310._M_string_length = 9;
  local_2e8.field_2._M_local_buf[0] = '.';
  local_2e8.field_2._M_local_buf[1] = '.';
  local_2e8.field_2._M_allocated_capacity._2_2_ = 0x2e2f;
  local_2e8.field_2._M_allocated_capacity._4_2_ = 0x2f2e;
  local_2e8.field_2._M_allocated_capacity._6_2_ = 0x6962;
  local_2e8.field_2._8_6_ = 0x687361622f6e;
  local_2e8._M_string_length = 0xe;
  local_2e8.field_2._M_local_buf[0xe] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  bVar5 = CheckRelativePath(&local_250,&local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x6168732f;
  local_250.field_2._8_2_ = 0x6572;
  local_250._M_string_length = 10;
  local_250.field_2._M_local_buf[10] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310.field_2._M_allocated_capacity._0_7_ = 0x68732f7273752f;
  local_310.field_2._M_local_buf[7] = 'a';
  local_310.field_2._8_2_ = 0x6572;
  local_310.field_2._10_2_ = 0x2f2f;
  local_310.field_2._M_local_buf[0xc] = 'b';
  local_310.field_2._13_2_ = 0x6e69;
  local_310._M_string_length = 0xf;
  local_310.field_2._M_local_buf[0xf] = '\0';
  local_2e8.field_2._M_local_buf[0] = 'b';
  local_2e8.field_2._M_local_buf[1] = 'i';
  local_2e8.field_2._M_allocated_capacity._2_2_ = 0x6e;
  local_2e8._M_string_length = 3;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2c4 = CheckRelativePath(&local_250,&local_310,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x7273752f;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x6168732f;
  local_250.field_2._8_2_ = 0x6572;
  local_250.field_2._M_local_buf[10] = '/';
  local_250.field_2._M_local_buf[0xb] = '*';
  local_250._M_string_length = 0xc;
  local_250.field_2._M_local_buf[0xc] = '\0';
  local_310.field_2._M_allocated_capacity._0_7_ = 0x68732f7273752f;
  local_310.field_2._M_local_buf[7] = 'a';
  local_310.field_2._8_2_ = 0x6572;
  local_310.field_2._10_2_ = 0x2a2f;
  local_310._M_string_length = 0xc;
  local_310.field_2._M_local_buf[0xc] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2c5 = CheckCollapsePath(&local_250,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250.field_2._M_allocated_capacity._0_4_ = 0x572f3a43;
  local_250.field_2._M_allocated_capacity._4_4_ = 0x6f646e69;
  local_250.field_2._8_2_ = 0x7377;
  local_250.field_2._M_local_buf[10] = '/';
  local_250.field_2._M_local_buf[0xb] = '*';
  local_250._M_string_length = 0xc;
  local_250.field_2._M_local_buf[0xc] = '\0';
  local_310.field_2._M_allocated_capacity._0_7_ = 0x646e69572f3a43;
  local_310.field_2._M_local_buf[7] = 'o';
  local_310.field_2._8_2_ = 0x7377;
  local_310.field_2._10_2_ = 0x2a2f;
  local_310._M_string_length = 0xc;
  local_310.field_2._M_local_buf[0xc] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_2c6 = CheckCollapsePath(&local_250,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (pointer)0x0;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x2a;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"[HKEY_LOCAL_MACHINE\\SOFTWARE\\MyApp; MyKey]",0x2a);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
             &local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x2a;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"[HKEY_LOCAL_MACHINE\\SOFTWARE\\MyApp; MyKey]",0x2a);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
             &local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x14;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"/Somewhere/something",0x14);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
             &local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_250.field_2._M_allocated_capacity._0_4_ = 0x706d742f;
  local_250._M_string_length = 4;
  local_250.field_2._M_allocated_capacity._4_4_ =
       local_250.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
             &local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_local_buf[0] = 'S';
  local_2e8.field_2._M_local_buf[1] = '\0';
  local_2e8._M_string_length = 1;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e8);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar11) {
    lVar19 = plVar10[3];
    local_310.field_2._M_allocated_capacity._0_7_ = (undefined7)paVar11->_M_allocated_capacity;
    local_310.field_2._M_local_buf[7] = (char)(paVar11->_M_allocated_capacity >> 0x38);
    local_310.field_2._8_2_ = (undefined2)lVar19;
    local_310.field_2._10_2_ = (undefined2)((ulong)lVar19 >> 0x10);
    local_310.field_2._M_local_buf[0xc] = (char)((ulong)lVar19 >> 0x20);
    local_310.field_2._13_2_ = (undefined2)((ulong)lVar19 >> 0x28);
    local_310.field_2._M_local_buf[0xf] = (char)((ulong)lVar19 >> 0x38);
  }
  else {
    local_310.field_2._M_allocated_capacity._0_7_ = (undefined7)paVar11->_M_allocated_capacity;
    local_310.field_2._M_local_buf[7] = (char)(paVar11->_M_allocated_capacity >> 0x38);
    local_310._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_310._M_string_length = plVar10[1];
  *plVar10 = (long)paVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  plVar13 = plVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar13) {
    lVar19 = plVar10[3];
    local_250.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar13;
    local_250.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar13 >> 0x20);
    local_250.field_2._8_2_ = (undefined2)lVar19;
    local_250.field_2._M_local_buf[10] = (char)((ulong)lVar19 >> 0x10);
    local_250.field_2._M_local_buf[0xb] = (char)((ulong)lVar19 >> 0x18);
    local_250.field_2._M_local_buf[0xc] = (char)((ulong)lVar19 >> 0x20);
    local_250.field_2._M_local_buf[0xd] = (char)((ulong)lVar19 >> 0x28);
    local_250.field_2._14_2_ = (undefined2)((ulong)lVar19 >> 0x30);
  }
  else {
    local_250.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar13;
    local_250.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar13 >> 0x20);
    local_250._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_250._M_string_length = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  bVar6 = CheckPutEnv(&local_250,"S","/Somewhere/something:/tmp");
  local_258 = (undefined4)CONCAT71(extraout_var,bVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2b8);
  cmsys::SystemTools::GetPath(&local_48,"S");
  if (((long)local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) ||
     (bVar6 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start), !bVar6)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"GetPath(",8);
    StringVectorToString
              (&local_250,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"S",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")  yielded ",0xb);
    StringVectorToString(&local_310,&local_48);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_310._M_dataplus._M_p,local_310._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," instead of ",0xc);
    StringVectorToString(&local_2e8,&local_278);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                        CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                          local_2e8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,
                      CONCAT17(local_310.field_2._M_local_buf[7],
                               local_310.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,
                      CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                               local_250.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_258 = 0;
  }
  local_2c7 = CheckUnPutEnv("S","S");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b8);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_310._M_dataplus._M_p = (pointer)0x10;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_310);
  local_250.field_2._M_allocated_capacity._0_4_ = SUB84(local_310._M_dataplus._M_p,0);
  local_250.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_310._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_250._M_dataplus._M_p,"testFindFile.txt",0x10);
  local_250._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_250._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  std::operator+(&local_310,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/build_O3/Source/kwsys/"
                 ,&local_250);
  std::__cxx11::string::string
            ((string *)&local_2e8,local_310._M_dataplus._M_p,(allocator *)local_2b8);
  bVar6 = cmsys::SystemTools::Touch(&local_2e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
  if (bVar6) {
    local_2b8 = (undefined1  [16])0x0;
    local_2a8 = (pointer)0x0;
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5c;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_2e8,(ulong)&local_278);
    pbVar17 = local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2e8.field_2._M_local_buf[0] =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    local_2e8.field_2._M_local_buf[1] =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_1_;
    local_2e8.field_2._M_allocated_capacity._2_2_ =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._2_2_;
    local_2e8.field_2._M_allocated_capacity._4_2_ =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._4_2_;
    local_2e8.field_2._M_allocated_capacity._6_2_ =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._6_2_;
    local_2e8._M_dataplus._M_p = (pointer)paVar11;
    memcpy(paVar11,
           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/build_O3/Source/kwsys"
           ,0x5c);
    local_2e8._M_string_length = (size_type)pbVar17;
    paVar11->_M_local_buf[(long)pbVar17] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2b8,
               &local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                        CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                          local_2e8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    psVar12 = cmsys::SystemTools::FindFile
                        (&local_2e8,&local_250,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2b8,true);
    sVar4 = local_2e8._M_string_length;
    local_29c = (undefined4)
                CONCAT71((int7)((ulong)psVar12 >> 8),
                         (pointer)local_2e8._M_string_length != (pointer)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                        CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                          local_2e8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((pointer)sVar4 == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with FindFile without system paths for: ",0x30);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_250._M_dataplus._M_p,
                          local_250._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    cmsys::SystemTools::FindFile
              (&local_2e8,&local_250,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8,false);
    sVar4 = local_2e8._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                        CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                                 CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                          local_2e8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((pointer)sVar4 == (pointer)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Problem with FindFile with system paths for: ",0x2d);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_250._M_dataplus._M_p,
                          local_250._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_29c = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem with Touch for: ",0x18);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_310._M_dataplus._M_p,local_310._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_29c = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,
                    CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                             local_250.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_250._M_dataplus._M_p = (pointer)0x5e;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_250);
  _Var14._M_p = local_250._M_dataplus._M_p;
  local_310.field_2._M_allocated_capacity._0_7_ = SUB87(local_250._M_dataplus._M_p,0);
  local_310.field_2._M_local_buf[7] = (char)((ulong)local_250._M_dataplus._M_p >> 0x38);
  local_310._M_dataplus._M_p = (pointer)paVar11;
  memcpy(paVar11,
         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/README.rst"
         ,0x5e);
  local_310._M_string_length = (size_type)_Var14._M_p;
  paVar11->_M_local_buf[(long)_Var14._M_p] = '\0';
  std::ifstream::ifstream(&local_250,local_310._M_dataplus._M_p,_S_in);
  if ((abStack_230[*(long *)(local_250._M_dataplus._M_p + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem opening: ",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_310._M_dataplus._M_p,local_310._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar18 = 0;
    goto LAB_0011c728;
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  auVar3[0xf] = 0;
  auVar3._0_15_ = local_2b8._1_15_;
  local_2b8 = auVar3 << 8;
  std::istream::seekg((long)&local_250,_S_beg);
  bVar6 = cmsys::SystemTools::GetLineFromStream
                    ((istream *)&local_250,&local_2e8,(bool *)local_2b8,-1);
  if (bVar6 && (pointer)local_2e8._M_string_length == (pointer)0x5) {
    std::istream::seekg((long)&local_250,_S_beg);
    bVar6 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&local_250,&local_2e8,(bool *)local_2b8,-1);
    if (!bVar6 || (pointer)local_2e8._M_string_length != (pointer)0x5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"First line does not have five characters after rewind: ",
                 0x37);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      goto LAB_0011c6f7;
    }
    bVar18 = 1;
    pbVar17 = (pointer)0x1;
    do {
      std::istream::seekg((long)&local_250,_S_beg);
      bVar6 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&local_250,&local_2e8,(bool *)local_2b8,(long)pbVar17);
      if (!bVar6 || pbVar17 != (pointer)local_2e8._M_string_length) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Should have read ",0x11);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," characters but got ",0x14);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        bVar18 = 0;
      }
      pbVar17 = (pointer)((long)&(pbVar17->_M_dataplus)._M_p + 1);
    } while (pbVar17 != (pointer)0x6);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"First line does not have five characters: ",0x2a);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
LAB_0011c6f7:
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar18 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT26(local_2e8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2e8.field_2._M_allocated_capacity._4_2_,
                                      CONCAT22(local_2e8.field_2._M_allocated_capacity._2_2_,
                                               CONCAT11(local_2e8.field_2._M_local_buf[1],
                                                        local_2e8.field_2._M_local_buf[0])))) + 1);
  }
LAB_0011c728:
  std::ifstream::~ifstream(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT17(local_310.field_2._M_local_buf[7],
                             local_310.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  return (int)(byte)(local_2e9 &
                     (byte)local_258 & local_2c7 & (byte)local_29c & bVar18 &
                     local_2c5 & local_2c6 & local_2c3 & bVar5 & local_2c1 & local_2c2 & local_2c4 &
                     local_2be & local_2bf & local_2c0 &
                     local_2bc & local_2bd & local_2ba & local_2bb & local_2b9 & (byte)local_254 ^ 1
                    );
}

Assistant:

int testSystemTools(int, char* [])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckGetLineFromStream();

  return res ? 0 : 1;
}